

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsf.c
# Opt level: O1

Qiniu_Error
Qiniu_RSF_ListFiles(Qiniu_Client *self,Qiniu_RSF_ListRet *ret,char *bucket,char *prefix,
                   char *delimiter,char *marker,int limit)

{
  Qiniu_RSF_ListRet *pQVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char **ppcVar6;
  Qiniu_Json *pQVar7;
  Qiniu_Json *pQVar8;
  _Qiniu_RSF_ListItem *p_Var9;
  char *pcVar10;
  Qiniu_Int64 QVar11;
  Qiniu_Int64 QVar12;
  Qiniu_Int64 QVar13;
  size_t __size;
  long lVar14;
  ulong uVar15;
  Qiniu_Error QVar16;
  char *local_98;
  cJSON *root;
  char *local_88;
  Qiniu_Json *local_80;
  char *local_78;
  Qiniu_Client *local_70;
  char *local_68;
  char *local_60;
  uint local_54;
  Qiniu_Bool escapeMarkerOk;
  Qiniu_Bool escapeDelimiterOk;
  Qiniu_Bool escapePrefixOk;
  Qiniu_Bool escapeBucketOk;
  Qiniu_RSF_ListRet *local_40;
  char *rsfHost;
  
  pcVar5 = (char *)(ulong)(uint)limit;
  if (limit - 0x3e9U < 0xfffffc18) {
    pcVar10 = "invalid list limit";
    local_54 = 400;
  }
  else {
    local_70 = self;
    local_88 = Qiniu_QueryEscape(bucket,&escapeBucketOk);
    local_80 = (Qiniu_Json *)0x11c821;
    local_98 = "";
    if (prefix != (char *)0x0) {
      local_80 = (Qiniu_Json *)Qiniu_QueryEscape(prefix,&escapePrefixOk);
    }
    local_78 = "";
    if (marker != (char *)0x0) {
      local_78 = Qiniu_QueryEscape(marker,&escapeMarkerOk);
    }
    local_60 = marker;
    local_40 = ret;
    if (delimiter != (char *)0x0) {
      local_98 = Qiniu_QueryEscape(delimiter,&escapeDelimiterOk);
    }
    local_68 = delimiter;
    iVar2 = snprintf((char *)0x0,0,"%d",pcVar5);
    __size = (size_t)(iVar2 + 1);
    pcVar4 = (char *)malloc(__size);
    memset(pcVar4,0,__size);
    snprintf(pcVar4,__size,"%d",(ulong)(uint)limit);
    QVar16 = _Qiniu_Region_Get_Rsf_Host(local_70,(char *)0x0,bucket,&rsfHost);
    pcVar10 = local_88;
    uVar3 = QVar16.code;
    if (uVar3 == 200) {
      pcVar5 = Qiniu_String_Concat(rsfHost,"/list?","bucket=",local_88,"&prefix=",local_80,
                                   "&delimiter=",local_98,"&marker=",local_78,"&limit=",pcVar4,0);
    }
    Qiniu_Free(pcVar4);
    if (escapeBucketOk != 0) {
      Qiniu_Free(pcVar10);
    }
    pQVar1 = local_40;
    pcVar10 = local_60;
    if ((prefix != (char *)0x0) && (escapePrefixOk != 0)) {
      Qiniu_Free(local_80);
    }
    if ((local_68 != (char *)0x0) && (escapeDelimiterOk != 0)) {
      Qiniu_Free(local_98);
    }
    if ((pcVar10 != (char *)0x0) && (escapeMarkerOk != 0)) {
      Qiniu_Free(local_78);
    }
    pcVar10 = QVar16.message;
    local_54 = uVar3;
    if (uVar3 == 200) {
      QVar16 = Qiniu_Client_Call(local_70,&root,pcVar5);
      uVar3 = QVar16.code;
      Qiniu_Free(pcVar5);
      pcVar10 = QVar16.message;
      local_54 = uVar3;
      if (uVar3 == 200) {
        local_88 = QVar16.message;
        pcVar5 = Qiniu_Json_GetString(root,"marker",(char *)0x0);
        pQVar1->marker = pcVar5;
        uVar3 = Qiniu_Json_GetArraySize(root,"commonPrefixes",0);
        if ((int)uVar3 < 1) {
          pQVar1->commonPrefixes = (char **)0x0;
          pQVar1->commonPrefixesCount = 0;
        }
        else {
          pQVar1->commonPrefixesCount = uVar3;
          ppcVar6 = (char **)malloc((ulong)uVar3 * 8);
          pQVar1->commonPrefixes = ppcVar6;
          lVar14 = 0;
          pQVar7 = Qiniu_Json_GetObjectItem(root,"commonPrefixes",(Qiniu_Json *)0x0);
          do {
            pQVar8 = Qiniu_Json_GetArrayItem(pQVar7,(int)lVar14,(Qiniu_Json *)0x0);
            ppcVar6[lVar14] = pQVar8->valuestring;
            lVar14 = lVar14 + 1;
          } while (uVar3 != (uint)lVar14);
        }
        uVar3 = Qiniu_Json_GetArraySize(root,"items",0);
        if ((int)uVar3 < 1) {
          pQVar1->items = (_Qiniu_RSF_ListItem *)0x0;
          pQVar1->itemsCount = 0;
          pcVar10 = local_88;
        }
        else {
          pQVar1->itemsCount = uVar3;
          local_78 = (char *)(ulong)uVar3;
          p_Var9 = (_Qiniu_RSF_ListItem *)malloc((long)local_78 * 0x38);
          pQVar1->items = p_Var9;
          uVar15 = 0;
          local_80 = Qiniu_Json_GetObjectItem(root,"items",(Qiniu_Json *)0x0);
          lVar14 = 0x30;
          do {
            pQVar7 = Qiniu_Json_GetArrayItem(local_80,(int)uVar15,(Qiniu_Json *)0x0);
            pcVar5 = Qiniu_Json_GetString(pQVar7,"key",(char *)0x0);
            local_70 = (Qiniu_Client *)Qiniu_Json_GetString(pQVar7,"hash",(char *)0x0);
            local_60 = Qiniu_Json_GetString(pQVar7,"mimeType",(char *)0x0);
            pcVar10 = Qiniu_Json_GetString(pQVar7,"endUser",(char *)0x0);
            pcVar4 = (char *)0x0;
            if (pcVar10 != (char *)0x0) {
              pcVar4 = Qiniu_Json_GetString(pQVar7,"endUser",(char *)0x0);
            }
            local_68 = pcVar4;
            QVar11 = Qiniu_Json_GetInt64(pQVar7,"putTime",0);
            QVar12 = Qiniu_Json_GetInt64(pQVar7,"fsize",0);
            QVar13 = Qiniu_Json_GetInt64(pQVar7,"type",0);
            p_Var9 = local_40->items;
            *(char **)((long)p_Var9 + lVar14 + -0x30) = pcVar5;
            *(Qiniu_Client **)((long)p_Var9 + lVar14 + -0x28) = local_70;
            *(char **)((long)p_Var9 + lVar14 + -0x20) = local_60;
            *(char **)((long)p_Var9 + lVar14 + -0x18) = local_68;
            *(Qiniu_Int64 *)((long)p_Var9 + lVar14 + -0x10) = QVar12;
            *(Qiniu_Int64 *)((long)p_Var9 + lVar14 + -8) = QVar11;
            *(Qiniu_Int64 *)((long)&p_Var9->key + lVar14) = QVar13;
            uVar15 = uVar15 + 1;
            lVar14 = lVar14 + 0x38;
            pcVar10 = local_88;
          } while (local_78 != (char *)uVar15);
        }
      }
    }
  }
  QVar16._4_4_ = 0;
  QVar16.code = local_54;
  QVar16.message = pcVar10;
  return QVar16;
}

Assistant:

Qiniu_Error Qiniu_RSF_ListFiles(Qiniu_Client *self, Qiniu_RSF_ListRet *ret, const char *bucket, const char *prefix,
                                const char *delimiter, const char *marker, int limit)
{
    Qiniu_Error err;
    int i;
    int prefixCount;
    int itemCount;

    if (limit < 1 || limit > 1000)
    {
        err.code = 400;
        err.message = "invalid list limit";
        return err;
    }

    cJSON *root;
    char *encodedBucket = NULL;
    char *encodedMarker = NULL;
    char *encodedPrefix = NULL;
    char *encodedDelimiter = NULL;

    char *url;
    const char *rsfHost;

    Qiniu_Bool escapeBucketOk;
    Qiniu_Bool escapePrefixOk;
    Qiniu_Bool escapeDelimiterOk;
    Qiniu_Bool escapeMarkerOk;

    encodedBucket = Qiniu_QueryEscape(bucket, &escapeBucketOk);

    if (prefix)
    {
        encodedPrefix = Qiniu_QueryEscape(prefix, &escapePrefixOk);
    }
    else
    {
        encodedPrefix = "";
    }

    if (marker)
    {
        encodedMarker = Qiniu_QueryEscape(marker, &escapeMarkerOk);
    }
    else
    {
        encodedMarker = "";
    }

    if (delimiter)
    {
        encodedDelimiter = Qiniu_QueryEscape(delimiter, &escapeDelimiterOk);
    }
    else
    {
        encodedDelimiter = "";
    }

    size_t limitLen = snprintf(NULL, 0, "%d", limit) + 1;
    char *limitStr = (char *)malloc(sizeof(char) * limitLen);
    memset(limitStr, 0, limitLen);
    snprintf(limitStr, limitLen, "%d", limit);

    err = _Qiniu_Region_Get_Rsf_Host(self, NULL, bucket, &rsfHost);

    if (err.code == 200)
    {
        url = Qiniu_String_Concat(rsfHost, "/list?", "bucket=", encodedBucket, "&prefix=", encodedPrefix,
                                  "&delimiter=", encodedDelimiter, "&marker=", encodedMarker, "&limit=", limitStr, NULL);
    }

    Qiniu_Free(limitStr);

    if (escapeBucketOk)
    {
        Qiniu_Free(encodedBucket);
    }

    if (prefix && escapePrefixOk)
    {
        Qiniu_Free(encodedPrefix);
    }

    if (delimiter && escapeDelimiterOk)
    {
        Qiniu_Free(encodedDelimiter);
    }

    if (marker && escapeMarkerOk)
    {
        Qiniu_Free(encodedMarker);
    }

    if (err.code != 200)
    {
        return err;
    }

    err = Qiniu_Client_Call(self, &root, url);
    Qiniu_Free(url);
    if (err.code == 200)
    {
        ret->marker = Qiniu_Json_GetString(root, "marker", NULL);
        // check common prefixes
        prefixCount = Qiniu_Json_GetArraySize(root, "commonPrefixes", 0);
        if (prefixCount > 0)
        {
            ret->commonPrefixesCount = prefixCount;
            ret->commonPrefixes = (char **)malloc(sizeof(char **) * prefixCount);
            char **p = ret->commonPrefixes;
            Qiniu_Json *commonPrefixes = Qiniu_Json_GetObjectItem(root, "commonPrefixes", NULL);
            for (i = 0; i < prefixCount; i++)
            {
                *p = Qiniu_Json_GetArrayItem(commonPrefixes, i, NULL)->valuestring;
                ++p;
            }
        }
        else
        {
            ret->commonPrefixes = NULL;
            ret->commonPrefixesCount = 0;
        }
        // check items
        itemCount = Qiniu_Json_GetArraySize(root, "items", 0);
        if (itemCount > 0)
        {
            ret->itemsCount = itemCount;
            ret->items = (Qiniu_RSF_ListItem *)malloc(sizeof(Qiniu_RSF_ListItem) * itemCount);

            Qiniu_Json *items = Qiniu_Json_GetObjectItem(root, "items", NULL);
            Qiniu_RSF_ListItem *nextItem = 0;
            for (i = 0; i < itemCount; i++)
            {
                Qiniu_Json *itemObj = Qiniu_Json_GetArrayItem(items, i, NULL);
                Qiniu_RSF_ListItem item;
                item.key = Qiniu_Json_GetString(itemObj, "key", NULL);
                item.hash = Qiniu_Json_GetString(itemObj, "hash", NULL);
                item.mimeType = Qiniu_Json_GetString(itemObj, "mimeType", NULL);
                if (Qiniu_Json_GetString(itemObj, "endUser", NULL) != 0)
                {
                    item.endUser = Qiniu_Json_GetString(itemObj, "endUser", NULL);
                }
                else
                {
                    item.endUser = NULL;
                }
                item.putTime = Qiniu_Json_GetInt64(itemObj, "putTime", 0);
                item.fsize = Qiniu_Json_GetInt64(itemObj, "fsize", 0);
                item.type = Qiniu_Json_GetInt64(itemObj, "type", 0);

                ret->items[i] = item;
            }
        }
        else
        {
            ret->items = NULL;
            ret->itemsCount = 0;
        }
    }

    return err;
}